

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

void stbir__empty_ring_buffer(stbir__info *stbir_info,int first_necessary_scanline)

{
  int iVar1;
  int channels;
  int alpha_channel;
  stbir_datatype sVar2;
  int num_pixels;
  stbir_colorspace sVar3;
  int iVar4;
  void *pvVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  
  iVar8 = stbir_info->ring_buffer_begin_index;
  if ((-1 < iVar8) &&
     (iVar7 = stbir_info->ring_buffer_first_scanline, iVar7 < first_necessary_scanline)) {
    iVar1 = stbir_info->output_stride_bytes;
    channels = stbir_info->channels;
    alpha_channel = stbir_info->alpha_channel;
    sVar2 = stbir_info->type;
    num_pixels = stbir_info->output_w;
    sVar3 = stbir_info->colorspace;
    pvVar5 = stbir_info->output_data;
    pfVar6 = stbir_info->ring_buffer;
    iVar4 = stbir_info->ring_buffer_length_bytes;
    do {
      if ((-1 < iVar7) && (iVar7 < stbir_info->output_h)) {
        stbir__encode_scanline
                  (stbir_info,num_pixels,(void *)((long)iVar7 * (long)iVar1 + (long)pvVar5),
                   pfVar6 + iVar8 * (iVar4 >> 2),channels,alpha_channel,sVar2 * 2 + sVar3);
        iVar7 = stbir_info->ring_buffer_first_scanline;
      }
      if (iVar7 == stbir_info->ring_buffer_last_scanline) {
        stbir_info->ring_buffer_begin_index = -1;
        stbir_info->ring_buffer_first_scanline = 0;
        stbir_info->ring_buffer_last_scanline = 0;
        return;
      }
      iVar7 = iVar7 + 1;
      stbir_info->ring_buffer_first_scanline = iVar7;
      iVar8 = (stbir_info->ring_buffer_begin_index + 1) % stbir_info->ring_buffer_num_entries;
      stbir_info->ring_buffer_begin_index = iVar8;
    } while (iVar7 < first_necessary_scanline);
  }
  return;
}

Assistant:

static void stbir__empty_ring_buffer(stbir__info* stbir_info, int first_necessary_scanline)
{
    int output_stride_bytes = stbir_info->output_stride_bytes;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int output_w = stbir_info->output_w;
    void* output_data = stbir_info->output_data;
    int decode = STBIR__DECODE(type, colorspace);

    float* ring_buffer = stbir_info->ring_buffer;
    int ring_buffer_length = stbir_info->ring_buffer_length_bytes/sizeof(float);

    if (stbir_info->ring_buffer_begin_index >= 0)
    {
        // Get rid of whatever we don't need anymore.
        while (first_necessary_scanline > stbir_info->ring_buffer_first_scanline)
        {
            if (stbir_info->ring_buffer_first_scanline >= 0 && stbir_info->ring_buffer_first_scanline < stbir_info->output_h)
            {
                int output_row_start = stbir_info->ring_buffer_first_scanline * output_stride_bytes;
                float* ring_buffer_entry = stbir__get_ring_buffer_entry(ring_buffer, stbir_info->ring_buffer_begin_index, ring_buffer_length);
                stbir__encode_scanline(stbir_info, output_w, (char *) output_data + output_row_start, ring_buffer_entry, channels, alpha_channel, decode);
                STBIR_PROGRESS_REPORT((float)stbir_info->ring_buffer_first_scanline / stbir_info->output_h);
            }

            if (stbir_info->ring_buffer_first_scanline == stbir_info->ring_buffer_last_scanline)
            {
                // We just popped the last scanline off the ring buffer.
                // Reset it to the empty state.
                stbir_info->ring_buffer_begin_index = -1;
                stbir_info->ring_buffer_first_scanline = 0;
                stbir_info->ring_buffer_last_scanline = 0;
                break;
            }
            else
            {
                stbir_info->ring_buffer_first_scanline++;
                stbir_info->ring_buffer_begin_index = (stbir_info->ring_buffer_begin_index + 1) % stbir_info->ring_buffer_num_entries;
            }
        }
    }
}